

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> __thiscall
FBX::Parser::parseScene(Parser *this)

{
  Node *pNVar1;
  long lVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  pointer psVar7;
  pointer psVar8;
  _Head_base<0UL,_const_FBX::Scene_*,_false> _Var9;
  __uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_> _Var10;
  int iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar13;
  size_type *psVar14;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar15;
  tuple<FBX::Scene_*,_std::default_delete<FBX::Scene>_> this_00;
  long lVar16;
  shared_ptr<FBX::Texture> *texture;
  pointer pNVar17;
  pointer pcVar18;
  pointer psVar19;
  pointer psVar20;
  shared_ptr<FBX::Material> *material;
  pointer psVar21;
  Node *in_RSI;
  Settings *pSVar22;
  undefined8 *puVar23;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *pvVar24;
  shared_ptr<FBX::Mesh> *mesh;
  pointer psVar25;
  byte bVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float in_XMM1_Da;
  Vector3 up;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> models;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> meshes;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeTextures;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeMaterials;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeModels;
  value_type nodeConnections;
  value_type nodeObjects;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeGeometry;
  Settings settings;
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [4];
  pointer local_250;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> local_248;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_230;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> local_218;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_200;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_1e8;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [24];
  pointer local_180;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_170;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_128;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_110;
  vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> local_f8;
  vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> local_d8;
  _Head_base<0UL,_const_FBX::Scene_*,_false> local_b8;
  pointer local_b0;
  pointer local_a8;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_a0;
  __uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_> local_88;
  Settings local_80;
  
  bVar26 = 0;
  pNVar1 = (Node *)in_RSI->propertyCount;
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"GlobalSettings","");
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_1b8,pNVar1,(string *)local_158);
  Settings::Settings(&local_80,(Node *)local_1b8._0_8_);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_1b8);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_148._M_allocated_capacity + 1);
  }
  pNVar1 = (Node *)in_RSI->propertyCount;
  local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Objects","");
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2a0,pNVar1,(string *)local_1b8);
  local_158._0_8_ = *(undefined8 *)local_2a0._0_8_;
  local_158._8_4_ = (undefined4)*(size_t *)(local_2a0._0_8_ + 8);
  local_158._12_4_ = *(undefined4 *)(local_2a0._0_8_ + 0xc);
  local_148._M_allocated_capacity = (size_type)&local_138;
  pcVar18 = (((string *)(local_2a0._0_8_ + 0x10))->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_158 + 0x10),pcVar18,pcVar18 + *(size_type *)(local_2a0._0_8_ + 0x18));
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_128,(vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_2a0._0_8_ + 0x30));
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_110,
           (vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
            *)(local_2a0._0_8_ + 0x48));
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2a0);
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  pNVar1 = (Node *)in_RSI->propertyCount;
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Connections","");
  findNodes(&local_230,pNVar1,(string *)local_2a0);
  local_1b8._0_8_ =
       (local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyCount;
  local_1b8._8_4_ =
       (undefined4)
       (local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyLength;
  local_1b8._12_4_ =
       *(undefined4 *)
        ((long)&(local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->propertyLength + 4);
  local_1a8._M_allocated_capacity = (size_type)local_198;
  pcVar18 = ((local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1b8 + 0x10),pcVar18,
             pcVar18 + ((local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl
                         .super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_198 + 0x10),
             &(local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_170,
           &(local_230.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
  }
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Model","");
  findNodes(&local_1d0,(Node *)local_158,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
  }
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Geometry","");
  findNodes(&local_a0,(Node *)local_158,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
  }
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Material","");
  findNodes(&local_1e8,(Node *)local_158,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
  }
  local_2a0._0_8_ = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Texture","");
  findNodes(&local_200,(Node *)local_158,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != local_290) {
    operator_delete((void *)local_2a0._0_8_,(ulong)(local_290[0]._M_allocated_capacity + 1));
  }
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_head_impl = (Scene *)this;
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  reserve(&local_d8,
          ((long)local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar17 = local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x48);
      Texture::Texture((Texture *)paVar12,pNVar17);
      local_2a0._0_8_ = paVar12;
      std::vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>::
      emplace_back<FBX::Texture*>
                ((vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>
                  *)&local_d8,(Texture **)local_2a0);
      pNVar17 = pNVar17 + 1;
    } while (pNVar17 !=
             local_200.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  reserve(&local_f8,
          ((long)local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar17 = local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0xc0);
      Material::Material((Material *)paVar12,pNVar17);
      local_2a0._0_8_ = paVar12;
      std::vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>::
      emplace_back<FBX::Material*>
                ((vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>
                  *)&local_f8,(Material **)local_2a0);
      pNVar17 = pNVar17 + 1;
    } while (pNVar17 !=
             local_1e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_218.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar17 = local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar13 = std::
                get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((pNVar17->properties).
                           super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
      iVar11 = std::__cxx11::string::compare((char *)pvVar13);
      if (iVar11 == 0) {
        up.y = (float)extraout_XMM0_Db;
        up.x = (float)extraout_XMM0_Da;
        up.z = in_XMM1_Da;
        parseMesh((Parser *)local_2a0,in_RSI,up);
        std::vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>>::
        emplace_back<std::shared_ptr<FBX::Mesh>>
                  ((vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>> *)
                   &local_218,(shared_ptr<FBX::Mesh> *)local_2a0);
        if ((pointer)local_2a0._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
        }
      }
      pNVar17 = pNVar17 + 1;
    } while (pNVar17 !=
             local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_248.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::reserve
            (&local_248,
             ((long)local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar17 = local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar13 = std::
                get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((pNVar17->properties).
                           super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
      iVar11 = std::__cxx11::string::compare((char *)pvVar13);
      if (iVar11 == 0) {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x28);
        psVar14 = (size_type *)
                  std::
                  get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                            ((pNVar17->properties).
                             super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        paVar12->_M_allocated_capacity = *psVar14;
        (((string *)(paVar12->_M_local_buf + 8))->_M_dataplus)._M_p = (pointer)0x0;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar12->_M_local_buf + 0x10))->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(paVar12->_M_local_buf + 0x18))->_M_allocated_capacity = 0;
        *(size_type *)(paVar12->_M_local_buf + 0x20) = 0;
        local_2a0._0_8_ = paVar12;
        std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>::
        emplace_back<FBX::Model*>
                  ((vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>
                    *)&local_248,(Model **)local_2a0);
      }
      pNVar17 = pNVar17 + 1;
    } while (pNVar17 !=
             local_1d0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_b0 = local_180;
  pcVar18 = (pointer)local_198._16_8_;
  if ((pointer)local_198._16_8_ != local_180) {
    do {
      pvVar15 = std::
                get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                            *)(*(long *)(pcVar18 + 0x48) + 0x30));
      lVar16 = *pvVar15;
      pvVar15 = std::
                get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                            *)(*(long *)(pcVar18 + 0x48) + 0x60));
      lVar2 = *pvVar15;
      local_250 = local_f8.
                  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      psVar19 = local_d8.
                super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = pcVar18;
      psVar7 = local_d8.
               super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar21 = local_f8.
                super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_f8.
          super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_f8.
          super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          for (; psVar8 = local_248.
                          super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish, psVar19 != psVar7;
              psVar19 = psVar19 + 1) {
            peVar3 = (psVar19->super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if ((lVar16 == (peVar3->super_Object).id) &&
               (peVar4 = (psVar21->super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr, lVar2 == (peVar4->super_Object).id)) {
              (peVar4->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar3;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(peVar4->texture).
                          super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         &(psVar19->super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount);
            }
          }
          if (local_248.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_248.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar20 = local_248.
                      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              peVar4 = (psVar21->super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              if ((lVar16 == (peVar4->super_Object).id) &&
                 (peVar5 = (psVar20->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr, lVar2 == (peVar5->super_Object).id)) {
                (peVar5->material).super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = peVar4;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(peVar5->material).
                            super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           &(psVar21->super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_refcount);
              }
              psVar20 = psVar20 + 1;
            } while (psVar20 != psVar8);
          }
          psVar21 = psVar21 + 1;
          psVar19 = local_d8.
                    super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = local_d8.
                   super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (psVar21 != local_250);
      }
      local_250 = (pointer)local_218.
                           super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      psVar25 = local_218.
                super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_218.
          super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_218.
          super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          psVar8 = local_248.
                   super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_248.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_248.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar20 = local_248.
                      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              peVar6 = (psVar25->super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if ((lVar16 == (peVar6->super_Object).id) &&
                 (peVar5 = (psVar20->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr, lVar2 == (peVar5->super_Object).id)) {
                (peVar5->mesh).super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     peVar6;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(peVar5->mesh).super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           &(psVar25->super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                            _M_refcount);
              }
              psVar20 = psVar20 + 1;
            } while (psVar20 != psVar8);
          }
          psVar25 = psVar25 + 1;
        } while ((pointer)psVar25 != local_250);
      }
      pcVar18 = local_a8 + 0x60;
    } while (pcVar18 != local_b0);
  }
  this_00.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>)operator_new(0x68);
  _Var9._M_head_impl = local_b8._M_head_impl;
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &local_230,&local_248);
  pSVar22 = &local_80;
  puVar23 = (undefined8 *)local_2a0;
  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
    *puVar23 = *(undefined8 *)&pSVar22->upAxis;
    pSVar22 = (Settings *)((long)pSVar22 + ((ulong)bVar26 * -2 + 1) * 8);
    puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
  }
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             this_00.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
             super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl,
             (vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &local_230);
  puVar23 = (undefined8 *)local_2a0;
  pvVar24 = (vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
            ((long)this_00.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
                   super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl + 0x18);
  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pvVar24->
    super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar23;
    puVar23 = puVar23 + (ulong)bVar26 * -2 + 1;
    pvVar24 = (vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
              ((long)pvVar24 + ((ulong)bVar26 * -2 + 1) * 8);
  }
  local_88._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
       (tuple<FBX::Scene_*,_std::default_delete<FBX::Scene>_>)
       (tuple<FBX::Scene_*,_std::default_delete<FBX::Scene>_>)
       this_00.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
       super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl;
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &local_230);
  _Var10._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
       local_88._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
       super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl;
  local_88._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
       (tuple<FBX::Scene_*,_std::default_delete<FBX::Scene>_>)
       (_Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>)0x0;
  ((_Var9._M_head_impl)->models).
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)_Var10._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
                super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl;
  std::unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_>::~unique_ptr
            ((unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_> *)&local_88);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            (&local_248);
  std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::~vector
            (&local_218);
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  ~vector(&local_f8);
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  ~vector(&local_d8);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_200);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_1e8);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_a0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_1d0);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_170);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_198 + 0x10));
  if ((pointer)local_1a8._M_allocated_capacity != (pointer)local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198._0_8_ + 1);
  }
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_110);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         _Var9._M_head_impl;
}

Assistant:

std::unique_ptr<const Scene> Parser::parseScene() const {
        Settings settings(findNodes(root, "GlobalSettings")[0]);

        const auto nodeObjects = findNodes(root, "Objects")[0];
        const auto nodeConnections = findNodes(root, "Connections")[0];
        const auto nodeModels = findNodes(nodeObjects, "Model");
        const auto nodeGeometry = findNodes(nodeObjects, "Geometry");
        const auto nodeMaterials = findNodes(nodeObjects, "Material");
        const auto nodeTextures = findNodes(nodeObjects, "Texture");

        std::vector<std::shared_ptr<Texture>> textures{};
        textures.reserve(nodeTextures.size());
        for (const auto &node : nodeTextures)
            textures.emplace_back(new Texture(node));

        std::vector<std::shared_ptr<Material>> materials{};
        materials.reserve(nodeMaterials.size());
        for (const auto &node : nodeMaterials)
            materials.emplace_back(new Material(node));

        std::vector<std::shared_ptr<Mesh>> meshes;
        for (const auto &node : nodeGeometry)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                meshes.push_back(parseMesh(node, {})); // TODO

        std::vector<std::shared_ptr<Model>> models;
        models.reserve(nodeModels.size());
        for (const auto &node : nodeModels)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                models.emplace_back(new Model(node));

        for (const auto &node : nodeConnections.children) {
            const auto source = std::get<int64_t>(node.properties[1]);
            const auto target = std::get<int64_t>(node.properties[2]);

            for (const auto &material : materials) {
                for (const auto &texture : textures)
                    if (source == texture->id && target == material->id)
                        material->texture = texture;

                for (const auto &model : models)
                    if (source == material->id && target == model->id)
                        model->material = material;
            }

            for (const auto &mesh : meshes)
                for (const auto &model : models)
                    if (source == mesh->id && target == model->id)
                        model->mesh = mesh;
        }

        return std::make_unique<Scene>(models, settings);
    }